

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::single_query_and_learn
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,example *ec)

{
  uint64_t *puVar1;
  polylabel *ppVar2;
  uint cn_00;
  uint32_t uVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  node *pnVar6;
  bool bVar7;
  double dVar8;
  wclass *pwVar9;
  label_t unaff_RBP;
  ulong uVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float weight;
  uint32_t cn;
  labels preds;
  labels multilabels;
  v_array<unsigned_int> path_to_leaf;
  float local_d0;
  uint local_cc;
  float *local_c8;
  float *pfStack_c0;
  float *local_b8;
  size_t sStack_b0;
  polyprediction *local_a0;
  wclass **local_98;
  wclass *local_90;
  v_array<unsigned_int> local_88;
  v_array<unsigned_int> local_68;
  wclass *local_48;
  size_t sStack_40;
  
  local_68.end_array = (uint *)0x0;
  local_68.erase_count = 0;
  local_68._begin = (uint *)0x0;
  local_68._end = (uint *)0x0;
  route_to_leaf(b,base,ec_array_index,0,&local_68,false);
  if (4 < (ulong)((long)local_68._end - (long)local_68._begin)) {
    fVar12 = merand48(&b->all->random_state);
    cn_00 = local_68._begin
            [(long)(fVar12 * (float)(ulong)((long)local_68._end - (long)local_68._begin >> 2)) &
             0xffffffff];
    local_cc = cn_00;
    if ((b->nodes)._begin[cn_00].internal == -1) {
      local_d0 = 1.0;
      if (b->learn_at_leaf == 1) {
        learn_at_leaf_random(b,base,&local_cc,ec,&local_d0);
      }
      if (b->oas == 1) {
        local_88.end_array = (uint *)0x0;
        local_88.erase_count = 0;
        local_88._begin = (uint *)0x0;
        local_88._end = (uint *)0x0;
        collect_labels_from_leaf(b,cn_00,&local_88);
        pwVar4 = (ec->l).cs.costs._begin;
        pwVar5 = (ec->l).cs.costs._end;
        local_98 = &(ec->l).cs.costs.end_array;
        local_48 = (ec->l).cs.costs.end_array;
        sStack_40 = (ec->l).cs.costs.erase_count;
        local_a0 = &ec->pred;
        local_c8 = (ec->pred).scalars._begin;
        pfStack_c0 = (ec->pred).scalars._end;
        local_b8 = (ec->pred).scalars.end_array;
        sStack_b0 = (ec->pred).scalars.erase_count;
        (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
        (ec->l).simple.initial = 0.0;
        if (local_88._end != local_88._begin) {
          local_90 = (wclass *)&pwVar4->class_index;
          uVar10 = 0;
          do {
            (ec->l).multi.label = 0xbf800000;
            bVar7 = pwVar4 != pwVar5;
            if (pwVar4 == pwVar5) {
LAB_001f8c66:
              if (bVar7) goto LAB_001f8c6b;
            }
            else {
              fVar12 = pwVar4->x;
              pwVar9 = local_90;
              while (fVar12 != *(float *)((long)local_88._begin + uVar10 * 4)) {
                bVar7 = pwVar9 != pwVar5;
                if (pwVar9 == pwVar5) goto LAB_001f8c66;
                fVar12 = pwVar9->x;
                pwVar9 = (wclass *)&pwVar9->class_index;
              }
LAB_001f8c6b:
              (ec->l).multi.label = 0x3f800000;
            }
            iVar11 = (int)b->max_routers + *(int *)((long)local_88._begin + uVar10 * 4) + 1;
            puVar1 = &(ec->super_example_predict).ft_offset;
            *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar11);
            (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec)
            ;
            puVar1 = &(ec->super_example_predict).ft_offset;
            *puVar1 = *puVar1 - (ulong)(uint)(iVar11 * *(int *)(base + 0xe0));
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)local_88._end - (long)local_88._begin >> 2));
        }
        (local_a0->scalars).end_array = local_b8;
        (local_a0->scalars).erase_count = sStack_b0;
        (local_a0->scalars)._begin = local_c8;
        (local_a0->scalars)._end = pfStack_c0;
        (ec->l).cs.costs._begin = pwVar4;
        (ec->l).cs.costs._end = pwVar5;
        *local_98 = local_48;
        local_98[1] = (wclass *)sStack_40;
      }
    }
    else {
      fVar12 = merand48(&b->all->random_state);
      fVar13 = (float)(ulong)((long)local_68._end - (long)local_68._begin >> 2);
      fVar13 = fVar13 / (fVar13 + -1.0);
      pnVar6 = (b->nodes)._begin;
      if (fVar12 < 0.5) {
        fVar13 = return_reward_from_node(b,base,pnVar6[cn_00].right,ec,fVar13);
        fVar12 = b->alpha;
        pnVar6 = (b->nodes)._begin;
        dVar8 = log(pnVar6[cn_00].nl / pnVar6[cn_00].nr);
        dVar8 = dVar8 * (1.0 - (double)fVar12) + (double)((fVar13 + fVar13) * b->alpha) * 0.5;
      }
      else {
        fVar13 = return_reward_from_node(b,base,pnVar6[cn_00].left,ec,fVar13);
        fVar12 = b->alpha;
        pnVar6 = (b->nodes)._begin;
        dVar8 = log(pnVar6[cn_00].nl / pnVar6[cn_00].nr);
        dVar8 = dVar8 * (1.0 - (double)fVar12) +
                ((double)fVar13 + (double)fVar13) * (double)b->alpha * -0.5;
      }
      ppVar2 = &ec->l;
      if (b->oas == 0) {
        unaff_RBP = ppVar2->multi;
      }
      else {
        local_88._begin = *(uint **)&ppVar2->multi;
        local_88._end = (uint *)(ec->l).cs.costs._end;
        local_88.end_array = (uint *)(ec->l).cs.costs.end_array;
        local_88.erase_count = (ec->l).cs.costs.erase_count;
        local_c8 = (ec->pred).scalars._begin;
        pfStack_c0 = (ec->pred).scalars._end;
        local_b8 = (ec->pred).scalars.end_array;
        sStack_b0 = (ec->pred).scalars.erase_count;
      }
      fVar12 = ec->weight;
      fVar13 = ABS((float)dVar8);
      ec->weight = fVar13;
      fVar14 = 100.0;
      if ((100.0 <= fVar13) || (fVar14 = 0.01, fVar13 < 0.01)) {
        ec->weight = fVar14;
      }
      (ec->l).simple.label = *(float *)(&DAT_00283390 + (ulong)((float)dVar8 < 0.0) * 4);
      *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
      uVar3 = (b->nodes)._begin[cn_00].base_router;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar3);
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar3 * *(int *)(base + 0xe0));
      if (b->oas == 0) {
        ppVar2->multi = unaff_RBP;
      }
      else {
        (ec->pred).scalars.end_array = local_b8;
        (ec->pred).scalars.erase_count = sStack_b0;
        (ec->pred).scalars._begin = local_c8;
        (ec->pred).scalars._end = pfStack_c0;
        (ec->l).cs.costs.end_array = (wclass *)local_88.end_array;
        (ec->l).cs.costs.erase_count = local_88.erase_count;
        ppVar2->multi = (label_t)local_88._begin;
        (ec->l).cs.costs._end = (wclass *)local_88._end;
      }
      ec->weight = fVar12;
    }
  }
  if (local_68._begin != (uint *)0x0) {
    free(local_68._begin);
  }
  return;
}

Assistant:

void single_query_and_learn(memory_tree& b, single_learner& base, const uint32_t& ec_array_index, example& ec){
        v_array<uint32_t> path_to_leaf = v_init<uint32_t>();
		route_to_leaf(b, base, ec_array_index, 0, path_to_leaf, false); //no insertion happens here.

        if (path_to_leaf.size() > 1){
            //uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()-1);
            uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()); //include leaf
            uint32_t cn = path_to_leaf[random_pos];
            
            if (b.nodes[cn].internal != -1){ //if it's an internal node:' 
                float objective = 0.f;
                float prob_right = 0.5;
                float coin = merand48(b.all->random_state) < prob_right ? 1.f : -1.f;
                float weight = path_to_leaf.size()*1.f/(path_to_leaf.size() - 1.f);
                if (coin == -1.f){ //go left
                    float reward_left_subtree = return_reward_from_node(b,base, b.nodes[cn].left, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(-reward_left_subtree/(1.-prob_right))/2.;
                }
                else{ //go right:
                    float reward_right_subtree= return_reward_from_node(b,base, b.nodes[cn].right, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(reward_right_subtree/prob_right)/2.;
                }
                
                float ec_input_weight = ec.weight;
                
                MULTICLASS::label_t mc;
                MULTILABEL::labels multilabels;
                MULTILABEL::labels preds;
                if (b.oas == false)
                    mc = ec.l.multi;
                else{
                    multilabels = ec.l.multilabels;
                    preds = ec.pred.multilabels;
                }
                
                ec.weight = fabs(objective);
                if (ec.weight >= 100.f) //crop the weight, otherwise sometimes cause NAN outputs.
                    ec.weight = 100.f;
                else if (ec.weight < .01f)
                    ec.weight = 0.01f;
                ec.l.simple = {objective < 0. ? -1.f : 1.f, 1.f, 0.};
                base.learn(ec, b.nodes[cn].base_router);
               
                if (b.oas == false)
                    ec.l.multi = mc;
                else{
                    ec.pred.multilabels = preds;
                    ec.l.multilabels = multilabels;
                }
                ec.weight = ec_input_weight; //restore the original weight
            }
            else{ //if it's a leaf node:
                float weight = 1.f; //float(path_to_leaf.size());
                if (b.learn_at_leaf == true)
                    learn_at_leaf_random(b, base, cn, ec, weight); //randomly sample one example, query reward, and update leaf learner

                if (b.oas == true)
                    train_one_against_some_at_leaf(b,base, cn, ec);
            }
        }
        path_to_leaf.delete_v();
    }